

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::validatePoppyExpression(FunctionValidator *this,Expression *curr)

{
  Id IVar1;
  FunctionValidator *this_00;
  bool bVar2;
  Index IVar3;
  Expression **ppEVar4;
  AbstractChildIterator<wasm::ChildIterator> *pAVar5;
  Iterator IVar6;
  AbstractChildIterator<wasm::ChildIterator> local_90;
  AbstractChildIterator<wasm::ChildIterator> *local_50;
  Iterator local_48;
  FunctionValidator *local_38;
  
  local_38 = this;
  if ((curr->type).id == 1) {
    bVar2 = StackUtils::mayBeUnreachable(curr);
    shouldBeTrue<wasm::Expression*>
              (local_38,bVar2,curr,
               "Only control flow structures and unreachable polymorphic instructions may be unreachable in Poppy IR"
              );
  }
  this_00 = local_38;
  IVar1 = curr->_id;
  if (IVar1 != BlockId) {
    if ((IVar1 == TryId) || (IVar1 == LoopId)) {
      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_90,curr);
      local_48.index = 0;
      local_48.parent = &local_90;
      IVar6 = AbstractChildIterator<wasm::ChildIterator>::end(&local_90);
      local_50 = IVar6.parent;
      IVar3 = 0;
      pAVar5 = &local_90;
      while ((IVar3 != IVar6.index || (pAVar5 != local_50))) {
        ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_48);
        shouldBeTrue<wasm::Expression*>
                  (local_38,(*ppEVar4)->_id == BlockId,curr,
                   "Expected control flow child to be a block");
        IVar3 = local_48.index + 1;
        pAVar5 = local_48.parent;
        local_48.index = IVar3;
      }
    }
    else {
      if (IVar1 == IfId) {
        shouldBeTrue<wasm::Expression*>
                  (local_38,**(int **)(curr + 1) == 0x28,curr,"Expected condition to be a Pop");
        shouldBeTrue<wasm::Expression*>
                  (this_00,*(int *)curr[1].type.id == 1,curr,
                   "Expected control flow child to be a block");
        if (*(int **)(curr + 2) == (int *)0x0) {
          bVar2 = true;
        }
        else {
          bVar2 = **(int **)(curr + 2) == 1;
        }
        shouldBeTrue<wasm::Expression*>
                  (local_38,bVar2,curr,"Expected control flow child to be a block");
        return;
      }
      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_90,curr);
      local_48.index = 0;
      local_48.parent = &local_90;
      IVar6 = AbstractChildIterator<wasm::ChildIterator>::end(&local_90);
      local_50 = IVar6.parent;
      IVar3 = 0;
      pAVar5 = &local_90;
      while ((IVar3 != IVar6.index || (pAVar5 != local_50))) {
        ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_48);
        shouldBeTrue<wasm::Expression*>
                  (local_38,(*ppEVar4)->_id == PopId,curr,"Unexpected non-Pop child");
        IVar3 = local_48.index + 1;
        pAVar5 = local_48.parent;
        local_48.index = IVar3;
      }
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_90.children.flexible.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
  }
  return;
}

Assistant:

void FunctionValidator::validatePoppyExpression(Expression* curr) {
  if (curr->type == Type::unreachable) {
    shouldBeTrue(StackUtils::mayBeUnreachable(curr),
                 curr,
                 "Only control flow structures and unreachable polymorphic"
                 " instructions may be unreachable in Poppy IR");
  }
  if (Properties::isControlFlowStructure(curr)) {
    // Check that control flow children (except If conditions) are blocks
    if (auto* if_ = curr->dynCast<If>()) {
      shouldBeTrue(
        if_->condition->is<Pop>(), curr, "Expected condition to be a Pop");
      shouldBeTrue(if_->ifTrue->is<Block>(),
                   curr,
                   "Expected control flow child to be a block");
      shouldBeTrue(!if_->ifFalse || if_->ifFalse->is<Block>(),
                   curr,
                   "Expected control flow child to be a block");
    } else if (!curr->is<Block>()) {
      for (auto* child : ChildIterator(curr)) {
        shouldBeTrue(child->is<Block>(),
                     curr,
                     "Expected control flow child to be a block");
      }
    }
  } else {
    // Check that all children are Pops
    for (auto* child : ChildIterator(curr)) {
      shouldBeTrue(child->is<Pop>(), curr, "Unexpected non-Pop child");
    }
  }
}